

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ansicolor_sink-inl.h
# Opt level: O0

string * spdlog::sinks::ansicolor_sink<spdlog::details::console_mutex>::to_string__abi_cxx11_
                   (string_view_t *sv)

{
  char *pcVar1;
  size_t sVar2;
  basic_string_view<char> *in_RSI;
  string *in_RDI;
  allocator local_11;
  basic_string_view<char> *local_10;
  
  local_10 = in_RSI;
  pcVar1 = ::fmt::v11::basic_string_view<char>::data(in_RSI);
  sVar2 = ::fmt::v11::basic_string_view<char>::size(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,pcVar1,sVar2,&local_11);
  std::allocator<char>::~allocator((allocator<char> *)&local_11);
  return in_RDI;
}

Assistant:

SPDLOG_INLINE std::string ansicolor_sink<ConsoleMutex>::to_string_(const string_view_t &sv) {
    return std::string(sv.data(), sv.size());
}